

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_andnot.c
# Opt level: O3

int run_array_container_andnot(run_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  rle16_t *prVar4;
  ushort *puVar5;
  rle16_t *prVar6;
  uint16_t *puVar7;
  uint16_t *puVar8;
  uint uVar9;
  _Bool _Var10;
  uint uVar11;
  run_container_t *prVar12;
  array_container_t *paVar13;
  bitset_container_t *src_1_00;
  run_container_t *prVar14;
  ushort uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  int32_t iVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  uint8_t return_type;
  byte local_3d [5];
  container_t **local_38;
  
  uVar11 = run_container_cardinality(src_1);
  if ((int)uVar11 < 0x21) {
    if (src_2->cardinality == 0) {
      prVar12 = run_container_clone(src_1);
      *dst = prVar12;
      uVar11 = 3;
    }
    else {
      prVar12 = run_container_create_given_capacity(src_2->cardinality + uVar11);
      iVar21 = src_1->n_runs;
      if (0 < iVar21) {
        prVar4 = src_1->runs;
        puVar5 = src_2->array;
        uVar17 = (uint)*puVar5;
        uVar11 = (uint)prVar4->value;
        uVar18 = (uint)prVar4->length + (uint)prVar4->value + 1;
        iVar3 = src_2->cardinality;
        uVar22 = 0;
        iVar20 = 0;
        do {
          uVar15 = (ushort)uVar11;
          if (iVar3 <= iVar20) {
            prVar6 = prVar12->runs;
            lVar19 = (long)prVar12->n_runs;
            prVar12->n_runs = (int32_t)(lVar19 + 1);
            prVar6[lVar19].value = uVar15;
            prVar6[lVar19].length = (short)uVar18 + ~uVar15;
            iVar3 = uVar22 + 1;
            iVar20 = src_1->n_runs - iVar3;
            if (iVar20 != 0 && iVar3 <= src_1->n_runs) {
              memcpy(prVar6 + lVar19 + 1,prVar4 + iVar3,(long)iVar20 << 2);
              prVar12->n_runs = prVar12->n_runs + ~uVar22 + src_1->n_runs;
            }
            break;
          }
          uVar9 = uVar11;
          if (uVar17 < uVar18) {
            if (uVar17 < uVar11) {
              iVar20 = iVar20 + 1;
              if (iVar20 < iVar3) {
                uVar17 = (uint)puVar5[iVar20];
              }
            }
            else {
              if (uVar11 < uVar17) {
                prVar6 = prVar12->runs;
                iVar24 = prVar12->n_runs;
                prVar12->n_runs = iVar24 + 1;
                prVar6[iVar24].value = uVar15;
                prVar6[iVar24].length = ~uVar15 + (short)uVar17;
                iVar21 = src_1->n_runs;
              }
              uVar9 = uVar17 + 1;
              if (uVar18 <= uVar17 + 1) goto LAB_0011dd55;
            }
          }
          else {
            prVar6 = prVar12->runs;
            iVar24 = prVar12->n_runs;
            prVar12->n_runs = iVar24 + 1;
            prVar6[iVar24].value = uVar15;
            prVar6[iVar24].length = ~uVar15 + (short)uVar18;
            iVar21 = src_1->n_runs;
LAB_0011dd55:
            uVar22 = uVar22 + 1;
            uVar9 = uVar11;
            if ((int)uVar22 < iVar21) {
              uVar18 = (uint)prVar4[(int)uVar22].length + (uint)prVar4[(int)uVar22].value + 1;
              uVar9 = (uint)prVar4[(int)uVar22].value;
            }
          }
          uVar11 = uVar9;
        } while ((int)uVar22 < iVar21);
      }
      prVar14 = (run_container_t *)convert_run_to_efficient_container(prVar12,local_3d);
      *dst = prVar14;
      if (prVar12 != prVar14) {
        run_container_free(prVar12);
      }
      uVar11 = (uint)local_3d[0];
    }
  }
  else if (uVar11 < 0x1001) {
    local_38 = dst;
    paVar13 = array_container_create_given_capacity(uVar11);
    iVar3 = src_1->n_runs;
    if ((long)iVar3 < 1) {
      iVar21 = 0;
    }
    else {
      prVar4 = src_1->runs;
      puVar7 = src_2->array;
      iVar20 = src_2->cardinality;
      iVar24 = -1;
      lVar19 = 0;
      iVar21 = 0;
      do {
        uVar15 = prVar4[lVar19].value;
        uVar11 = (uint)uVar15;
        uVar1 = prVar4[lVar19].length;
        iVar23 = iVar24 + 1;
        iVar25 = iVar23;
        if ((iVar23 < iVar20) && (puVar7[iVar23] < uVar15)) {
          iVar25 = iVar24 + 2;
          iVar16 = 1;
          if (iVar25 < iVar20) {
            iVar16 = 1;
            do {
              uVar2 = puVar7[iVar25];
              if (uVar15 <= uVar2) goto LAB_0011de53;
              iVar24 = iVar16 * 2;
              iVar25 = iVar23 + iVar16 * 2;
              iVar16 = iVar24;
            } while (iVar25 < iVar20);
          }
          uVar2 = puVar7[(long)iVar20 + -1];
          iVar25 = iVar20 + -1;
LAB_0011de53:
          if (uVar2 == uVar15) goto LAB_0011de60;
          iVar24 = iVar20;
          if (uVar15 <= uVar2) {
            if (iVar23 + (iVar16 >> 1) + 1 != iVar25) {
              iVar23 = (iVar16 >> 1) + iVar23;
              iVar24 = iVar25;
              do {
                iVar25 = iVar23 + iVar24 >> 1;
                if (puVar7[iVar25] == uVar15) break;
                iVar16 = iVar25;
                if (puVar7[iVar25] < uVar15) {
                  iVar16 = iVar24;
                  iVar23 = iVar25;
                }
                iVar25 = iVar16;
                iVar24 = iVar25;
              } while (iVar23 + 1 != iVar25);
            }
            goto LAB_0011de60;
          }
LAB_0011dea4:
          puVar8 = paVar13->array;
          lVar26 = 0;
          do {
            puVar8[iVar21 + lVar26] = uVar15 + (short)lVar26;
            lVar26 = lVar26 + 1;
          } while (uVar1 + 1 != (int)lVar26);
          iVar21 = iVar21 + (int)lVar26;
        }
        else {
LAB_0011de60:
          iVar24 = iVar25;
          if (iVar20 <= iVar25) goto LAB_0011dea4;
          uVar17 = (uint)puVar7[iVar25];
          if ((uint)uVar1 + (uint)uVar15 < (uint)puVar7[iVar25]) {
            puVar8 = paVar13->array;
            lVar26 = 0;
            do {
              puVar8[iVar21 + lVar26] = uVar15 + (short)lVar26;
              lVar26 = lVar26 + 1;
            } while (uVar1 + 1 != (int)lVar26);
            iVar21 = iVar21 + (int)lVar26;
          }
          else {
            iVar24 = uVar1 + 1;
            do {
              if (uVar11 == uVar17) {
                iVar23 = iVar25 + 1;
                if (iVar23 < iVar20) {
                  uVar17 = (uint)puVar7[iVar23];
                  iVar25 = iVar23;
                }
                else {
                  uVar17 = 0;
                }
              }
              else {
                lVar26 = (long)iVar21;
                iVar21 = iVar21 + 1;
                paVar13->array[lVar26] = (uint16_t)uVar11;
              }
              uVar11 = uVar11 + 1;
              iVar24 = iVar24 + -1;
            } while (iVar24 != 0);
          }
          iVar24 = iVar25 + -1;
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != iVar3);
    }
    paVar13->cardinality = iVar21;
    *local_38 = paVar13;
    uVar11 = 2;
  }
  else {
    src_1_00 = bitset_container_from_run(src_1);
    _Var10 = bitset_array_container_iandnot(src_1_00,src_2,dst);
    uVar11 = 2 - _Var10;
  }
  return uVar11;
}

Assistant:

int run_array_container_andnot(const run_container_t *src_1,
                               const array_container_t *src_2,
                               container_t **dst) {
    // follows the Java impl as of June 2016

    int card = run_container_cardinality(src_1);
    const int arbitrary_threshold = 32;

    if (card <= arbitrary_threshold) {
        if (src_2->cardinality == 0) {
            *dst = run_container_clone(src_1);
            return RUN_CONTAINER_TYPE;
        }
        // Java's "lazyandNot.toEfficientContainer" thing
        run_container_t *answer = run_container_create_given_capacity(
            card + array_container_cardinality(src_2));

        int rlepos = 0;
        int xrlepos = 0;  // "x" is src_2
        rle16_t rle = src_1->runs[rlepos];
        int32_t start = rle.value;
        int32_t end = start + rle.length + 1;
        int32_t xstart = src_2->array[xrlepos];

        while ((rlepos < src_1->n_runs) && (xrlepos < src_2->cardinality)) {
            if (end <= xstart) {
                // output the first run
                answer->runs[answer->n_runs++] =
                    MAKE_RLE16(start, end - start - 1);
                rlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }
            } else if (xstart + 1 <= start) {
                // exit the second run
                xrlepos++;
                if (xrlepos < src_2->cardinality) {
                    xstart = src_2->array[xrlepos];
                }
            } else {
                if (start < xstart) {
                    answer->runs[answer->n_runs++] =
                        MAKE_RLE16(start, xstart - start - 1);
                }
                if (xstart + 1 < end) {
                    start = xstart + 1;
                } else {
                    rlepos++;
                    if (rlepos < src_1->n_runs) {
                        start = src_1->runs[rlepos].value;
                        end = start + src_1->runs[rlepos].length + 1;
                    }
                }
            }
        }
        if (rlepos < src_1->n_runs) {
            answer->runs[answer->n_runs++] = MAKE_RLE16(start, end - start - 1);
            rlepos++;
            if (rlepos < src_1->n_runs) {
                memcpy(answer->runs + answer->n_runs, src_1->runs + rlepos,
                       (src_1->n_runs - rlepos) * sizeof(rle16_t));
                answer->n_runs += (src_1->n_runs - rlepos);
            }
        }
        uint8_t return_type;
        *dst = convert_run_to_efficient_container(answer, &return_type);
        if (answer != *dst) run_container_free(answer);
        return return_type;
    }
    // else it's a bitmap or array

    if (card <= DEFAULT_MAX_SIZE) {
        array_container_t *ac = array_container_create_given_capacity(card);
        // nb Java code used a generic iterator-based merge to compute
        // difference
        ac->cardinality = run_array_array_subtract(src_1, src_2, ac);
        *dst = ac;
        return ARRAY_CONTAINER_TYPE;
    }
    bitset_container_t *ans = bitset_container_from_run(src_1);
    bool result_is_bitset = bitset_array_container_iandnot(ans, src_2, dst);
    return (result_is_bitset ? BITSET_CONTAINER_TYPE : ARRAY_CONTAINER_TYPE);
}